

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::tableLanguage(GrpParser *this)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long *in_RDI;
  GrpParser *in_stack_00000010;
  GrpParser *in_stack_00000070;
  GrpParser *in_stack_00000080;
  ParserException *ex;
  RefAST tmp42_AST;
  RefAST tmp41_AST;
  RefAST tmp40_AST;
  RefAST tmp39_AST;
  RefAST tableLanguage_AST;
  ASTPair currentAST;
  ASTPair *in_stack_fffffffffffffea0;
  RefCount<AST> *in_stack_fffffffffffffea8;
  ASTPair *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  RefCount<AST> *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  ASTFactory *in_stack_fffffffffffffed8;
  Parser *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  ASTFactory *in_stack_fffffffffffffef0;
  ASTFactory *this_00;
  RefAST *t;
  NoViableAltException *in_stack_ffffffffffffff20;
  undefined1 local_b8 [8];
  undefined1 local_b0 [16];
  GrpParser *in_stack_ffffffffffffff60;
  undefined1 local_90 [16];
  undefined1 local_80 [32];
  undefined1 local_60 [24];
  undefined1 local_48 [72];
  
  t = &nullAST;
  RefCount<AST>::operator=
            (in_stack_fffffffffffffec0,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  ASTPair::ASTPair(in_stack_fffffffffffffeb0);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
  (**(code **)(*in_RDI + 0x28))(local_48,in_RDI,1);
  ASTFactory::create(in_stack_fffffffffffffed8,
                     (RefToken *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  RefCount<AST>::operator=
            (in_stack_fffffffffffffec0,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffea0->root);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffeb0);
  Parser::match(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
  (**(code **)(*in_RDI + 0x28))(local_60,in_RDI,1);
  ASTFactory::create(in_stack_fffffffffffffed8,
                     (RefToken *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  RefCount<AST>::operator=
            (in_stack_fffffffffffffec0,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffea0->root);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffeb0);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
  ASTFactory::addASTChild
            (in_stack_fffffffffffffef0,
             (ASTPair *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             (RefAST *)in_stack_fffffffffffffee0);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffea0->root);
  Parser::match(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
  this_00 = (ASTFactory *)(in_RDI + 6);
  (**(code **)(*in_RDI + 0x28))(local_80,in_RDI,1);
  ASTFactory::create(in_stack_fffffffffffffed8,
                     (RefToken *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  RefCount<AST>::operator=
            (in_stack_fffffffffffffec0,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffea0->root);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffeb0);
  Parser::match(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  iVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (1 < iVar1 - 8U) {
    if (iVar1 == 0xb) {
      directives(in_stack_ffffffffffffff60);
      in_stack_fffffffffffffee0 = (Parser *)(in_RDI + 6);
      RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
      ASTFactory::addASTChild
                (this_00,(ASTPair *)CONCAT44(iVar1,in_stack_fffffffffffffee8),
                 (RefAST *)in_stack_fffffffffffffee0);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffea0->root);
    }
    else if (2 < iVar1 - 0xdU) {
      uVar3 = __cxa_allocate_exception(0x40);
      (**(code **)(*in_RDI + 0x28))(local_90,in_RDI,1);
      NoViableAltException::NoViableAltException(in_stack_ffffffffffffff20,(RefToken *)t);
      __cxa_throw(uVar3,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
  }
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (iVar2 == 8) {
    RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
    (**(code **)(*in_RDI + 0x28))(local_b0,in_RDI,1);
    ASTFactory::create(in_stack_fffffffffffffed8,
                       (RefToken *)CONCAT44(iVar2,in_stack_fffffffffffffed0));
    iVar2 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    RefCount<AST>::operator=
              (in_stack_fffffffffffffec0,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffea0->root);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffeb0);
    Parser::match(in_stack_fffffffffffffee0,iVar2);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffea0->root);
  }
  else if ((iVar2 != 9) && (2 < iVar2 - 0xdU)) {
    uVar3 = __cxa_allocate_exception(0x40);
    (**(code **)(*in_RDI + 0x28))(local_b8,in_RDI,1);
    NoViableAltException::NoViableAltException(in_stack_ffffffffffffff20,(RefToken *)t);
    __cxa_throw(uVar3,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
  while( true ) {
    while( true ) {
      while (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1), iVar2 == 9) {
        languageEnv(in_stack_00000010);
        in_stack_fffffffffffffeb0 = (ASTPair *)(in_RDI + 6);
        RefCount<AST>::RefCount
                  ((RefCount<AST> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        ASTFactory::addASTChild
                  (this_00,(ASTPair *)CONCAT44(iVar1,in_stack_fffffffffffffee8),
                   (RefAST *)in_stack_fffffffffffffee0);
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffea0->root);
      }
      if (iVar2 != 0xd) break;
      languageSpecList(in_stack_00000070);
      in_stack_fffffffffffffea8 = (RefCount<AST> *)(in_RDI + 6);
      RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
      ASTFactory::addASTChild
                (this_00,(ASTPair *)CONCAT44(iVar1,in_stack_fffffffffffffee8),
                 (RefAST *)in_stack_fffffffffffffee0);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffea0->root);
    }
    if (iVar2 != 0xe) break;
    tableDecl(in_stack_00000080);
    in_stack_fffffffffffffea0 = (ASTPair *)(in_RDI + 6);
    RefCount<AST>::RefCount(&in_stack_fffffffffffffeb0->root,in_stack_fffffffffffffea8);
    ASTFactory::addASTChild
              (this_00,(ASTPair *)CONCAT44(iVar1,in_stack_fffffffffffffee8),
               (RefAST *)in_stack_fffffffffffffee0);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffea0->root);
  }
  RefCount<AST>::operator=
            (in_stack_fffffffffffffec0,(RefCount<AST> *)CONCAT44(iVar2,in_stack_fffffffffffffeb8));
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffea0->root);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffea0->root);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffea0->root);
  RefCount<AST>::operator=
            (in_stack_fffffffffffffec0,(RefCount<AST> *)CONCAT44(iVar2,in_stack_fffffffffffffeb8));
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffea0->root);
  ASTPair::~ASTPair(in_stack_fffffffffffffea0);
  return;
}

Assistant:

void GrpParser::tableLanguage() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST tableLanguage_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp39_AST = nullAST;
		tmp39_AST = astFactory.create(LT(1));
		match(OP_LPAREN);
		RefAST tmp40_AST = nullAST;
		tmp40_AST = astFactory.create(LT(1));
		astFactory.addASTChild(currentAST, tmp40_AST);
		match(LITERAL_language);
		RefAST tmp41_AST = nullAST;
		tmp41_AST = astFactory.create(LT(1));
		match(OP_RPAREN);
		{
		switch ( LA(1)) {
		case OP_LBRACE:
		{
			directives();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case OP_SEMI:
		case LITERAL_environment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp42_AST = nullAST;
			tmp42_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case LITERAL_environment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		do {
			switch ( LA(1)) {
			case LITERAL_environment:
			{
				languageEnv();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			case IDENT:
			{
				languageSpecList();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			case LITERAL_table:
			{
				tableDecl();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			default:
			{
				goto _loop156;
			}
			}
		} while (true);
		_loop156:;
		}
		tableLanguage_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_11);
	}
	returnAST = tableLanguage_AST;
}